

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseEqn.c
# Opt level: O2

Hop_Obj_t *
Parse_FormulaParserEqn(FILE *pOutput,char *pFormInit,Vec_Ptr_t *vVarNames,Hop_Man_t *pMan)

{
  char cVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int Oper;
  size_t sVar6;
  byte *__s;
  Parse_StackFn_t *p;
  Parse_StackOp_t *p_00;
  Hop_Obj_t *pHVar7;
  void *pvVar8;
  byte *__s1;
  char *pcVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  size_t sStack_70;
  byte *local_60;
  
  iVar5 = 0;
  pcVar9 = pFormInit;
  do {
    cVar1 = *pcVar9;
    if (cVar1 == '(') {
      iVar5 = iVar5 + 1;
    }
    else if (cVar1 == ')') {
      iVar5 = iVar5 + -1;
    }
    else if (cVar1 == '\0') break;
    pcVar9 = pcVar9 + 1;
  } while( true );
  if (iVar5 != 0) {
    fwrite("Parse_FormulaParserEqn(): Different number of opening and closing parentheses ().\n",
           0x52,1,(FILE *)pOutput);
    return (Hop_Obj_t *)0x0;
  }
  sVar6 = strlen(pFormInit);
  __s = (byte *)malloc(sVar6 + 3);
  sprintf((char *)__s,"(%s)",pFormInit);
  p = Parse_StackFnStart(1000);
  p_00 = Parse_StackOpStart(1000);
  iVar5 = 1;
  __s1 = __s;
LAB_003b61f5:
  bVar3 = *__s1;
  local_60 = __s1;
  switch(bVar3) {
  case 0x20:
    break;
  case 0x21:
    if (iVar5 == 2) {
      Parse_StackOpPush(p_00,9);
      iVar5 = 10;
      goto LAB_003b6314;
    }
    Parse_StackOpPush(p_00,10);
    if (iVar5 == 1) {
      iVar5 = 1;
      break;
    }
    goto LAB_003b6320;
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
switchD_003b6211_caseD_22:
    lVar10 = -0x100000000;
    local_60 = (byte *)0x0;
    do {
      if (bVar3 < 0x2c) {
        if ((0xe0100002601U >> ((ulong)bVar3 & 0x3f) & 1) != 0) {
          bVar12 = iVar5 == 2;
          goto LAB_003b63f0;
        }
        if ((0x10200000000U >> ((ulong)bVar3 & 0x3f) & 1) != 0) goto LAB_003b6516;
      }
      bVar3 = __s1[(long)local_60 + 1];
      local_60 = (byte *)((long)local_60 + 1);
      lVar10 = lVar10 + 0x100000000;
    } while( true );
  case 0x28:
    Oper = 1;
    bVar12 = iVar5 != 2;
    iVar5 = 1;
    if (bVar12) goto LAB_003b64f8;
    pcVar9 = 
    "Parse_FormulaParserEqn(): An opening parenthesis follows a var without operation sign.\n";
    sStack_70 = 0x57;
LAB_003b65b4:
    fwrite(pcVar9,sStack_70,1,(FILE *)pOutput);
LAB_003b65c1:
    free(__s);
    return (Hop_Obj_t *)0x0;
  case 0x29:
    iVar5 = Parse_StackOpIsEmpty(p_00);
    if (iVar5 == 0) {
      while( true ) {
        iVar5 = Parse_StackOpIsEmpty(p_00);
        if (iVar5 != 0) goto LAB_003b6590;
        iVar5 = Parse_StackOpPop(p_00);
        if (iVar5 == 1) break;
        pHVar7 = Parse_ParserPerformTopOp(pMan,p,iVar5);
        if (pHVar7 == (Hop_Obj_t *)0x0) {
          Parse_StackFnFree(p);
          Parse_StackOpFree(p_00);
          pcVar9 = "Parse_FormulaParserEqn(): Unknown operation\n";
          sStack_70 = 0x2c;
          goto LAB_003b65b4;
        }
      }
      goto LAB_003b64d8;
    }
LAB_003b6590:
    pcVar9 = "Parse_FormulaParserEqn(): There is no opening parenthesis\n";
    sStack_70 = 0x3a;
    goto LAB_003b65b4;
  case 0x2a:
  case 0x2b:
    if (iVar5 != 2) {
      pcVar9 = "Parse_FormulaParserEqn(): There is no variable before AND, EXOR, or OR.\n";
      sStack_70 = 0x48;
      goto LAB_003b65b4;
    }
    iVar5 = (uint)(bVar3 == 0x2a) * 2 + 7;
LAB_003b6314:
    Parse_StackOpPush(p_00,iVar5);
    iVar5 = 3;
LAB_003b6320:
    while( true ) {
      Oper = Parse_StackOpPop(p_00);
      iVar4 = Parse_StackOpIsEmpty(p_00);
      if (iVar4 != 0) break;
      iVar4 = Parse_StackOpPop(p_00);
      if (iVar4 < Oper) {
        Parse_StackOpPush(p_00,iVar4);
        break;
      }
      pHVar7 = Parse_ParserPerformTopOp(pMan,p,iVar4);
      if (pHVar7 == (Hop_Obj_t *)0x0) {
        fwrite("Parse_FormulaParserEqn(): Unknown operation\n",0x2c,1,(FILE *)pOutput);
        free(__s);
        Parse_StackFnFree(p);
        Parse_StackOpFree(p_00);
        return (Hop_Obj_t *)0x0;
      }
      Parse_StackOpPush(p_00,Oper);
    }
LAB_003b64f8:
    Parse_StackOpPush(p_00,Oper);
    __s1 = local_60;
    break;
  case 0x30:
    Parse_StackFnPush(p,(void *)((ulong)pMan->pConst1 ^ 1));
    if (iVar5 != 2) goto LAB_003b64d8;
    pcVar9 = "Parse_FormulaParserEqn(): No operation symbol before constant 0.\n";
LAB_003b6603:
    sStack_70 = 0x41;
    goto LAB_003b65b4;
  case 0x31:
    Parse_StackFnPush(p,pMan->pConst1);
    if (iVar5 == 2) {
      pcVar9 = "Parse_FormulaParserEqn(): No operation symbol before constant 1.\n";
      goto LAB_003b6603;
    }
    goto LAB_003b64d8;
  default:
    if ((1 < bVar3 - 9) && (bVar3 != 0xd)) {
      if (bVar3 != 0) goto switchD_003b6211_caseD_22;
      iVar5 = Parse_StackFnIsEmpty(p);
      if (iVar5 == 0) {
        pHVar7 = (Hop_Obj_t *)Parse_StackFnPop(p);
        iVar5 = Parse_StackFnIsEmpty(p);
        if (iVar5 == 0) {
          pcVar9 = "Parse_FormulaParserEqn(): Something is left in the function stack\n";
          sStack_70 = 0x42;
        }
        else {
          iVar5 = Parse_StackOpIsEmpty(p_00);
          if (iVar5 != 0) {
            Parse_StackFnFree(p);
            Parse_StackOpFree(p_00);
            free(__s);
            return pHVar7;
          }
          pcVar9 = "Parse_FormulaParserEqn(): Something is left in the operation stack\n";
          sStack_70 = 0x43;
        }
      }
      else {
        pcVar9 = "Parse_FormulaParserEqn(): The input string is empty\n";
        sStack_70 = 0x34;
      }
      goto LAB_003b65b4;
    }
  }
switchD_003b6211_caseD_20:
  __s1 = __s1 + 1;
  goto LAB_003b61f5;
LAB_003b6516:
  fwrite("Parse_FormulaParserEqn(): The negation sign or an opening parenthesis inside the variable name.\n"
         ,0x60,1,(FILE *)pOutput);
  bVar12 = false;
LAB_003b63f0:
  uVar2 = vVarNames->nSize;
  if (vVarNames->nSize < 1) {
    uVar2 = 0;
  }
  uVar11 = 0;
  while( true ) {
    if (uVar2 == uVar11) {
      pcVar9 = 
      "Parse_FormulaParserEqn(): The parser cannot find var \"%s\" in the input var list.\n";
      goto LAB_003b6552;
    }
    pcVar9 = (char *)vVarNames->pArray[uVar11];
    iVar5 = strncmp((char *)__s1,pcVar9,(size_t)local_60);
    if ((iVar5 == 0) && (sVar6 = strlen(pcVar9), (byte *)sVar6 == local_60)) break;
    uVar11 = uVar11 + 1;
  }
  __s1 = __s1 + (lVar10 >> 0x20);
  if (bVar12) {
    pcVar9 = 
    "Parse_FormulaParserEqn(): The variable name \"%s\" follows another var without operation sign.\n"
    ;
LAB_003b6552:
    fprintf((FILE *)pOutput,pcVar9,__s1);
    goto LAB_003b65c1;
  }
  pHVar7 = Hop_IthVar(pMan,(int)uVar11);
  Parse_StackFnPush(p,pHVar7);
  local_60 = __s1;
LAB_003b64d8:
  while (iVar5 = Parse_StackOpIsEmpty(p_00), iVar5 == 0) {
    Oper = Parse_StackOpPop(p_00);
    if (Oper != 10) {
      iVar5 = 2;
      goto LAB_003b64f8;
    }
    pvVar8 = Parse_StackFnPop(p);
    Parse_StackFnPush(p,(void *)((ulong)pvVar8 ^ 1));
  }
  iVar5 = 2;
  __s1 = local_60;
  goto switchD_003b6211_caseD_20;
}

Assistant:

Hop_Obj_t * Parse_FormulaParserEqn( FILE * pOutput, char * pFormInit, Vec_Ptr_t * vVarNames, Hop_Man_t * pMan )
{
    char * pFormula;
    Parse_StackFn_t * pStackFn;
    Parse_StackOp_t * pStackOp;
    Hop_Obj_t * gFunc;
    char * pTemp, * pName;
    int nParans, fFound, Flag;
	int Oper, Oper1, Oper2;
    int i, v;

    // make sure that the number of opening and closing parentheses is the same
    nParans = 0;
    for ( pTemp = pFormInit; *pTemp; pTemp++ )
        if ( *pTemp == '(' )
            nParans++;
        else if ( *pTemp == ')' )
            nParans--;
    if ( nParans != 0 )
    {
        fprintf( pOutput, "Parse_FormulaParserEqn(): Different number of opening and closing parentheses ().\n" );
        return NULL;
    }

    // copy the formula
    pFormula = ABC_ALLOC( char, strlen(pFormInit) + 3 );
    sprintf( pFormula, "(%s)", pFormInit );

    // start the stacks
    pStackFn = Parse_StackFnStart( PARSE_EQN_STACKSIZE );
    pStackOp = Parse_StackOpStart( PARSE_EQN_STACKSIZE );

    Flag = PARSE_EQN_FLAG_START;
    for ( pTemp = pFormula; *pTemp; pTemp++ )
	{
		switch ( *pTemp )
	    {
		// skip all spaces, tabs, and end-of-lines
        case ' ':
        case '\t':
        case '\r':
        case '\n':
			continue;
		case PARSE_EQN_SYM_CONST0:
		    Parse_StackFnPush( pStackFn, Hop_ManConst0(pMan) );  // Cudd_Ref( b0 );
			if ( Flag == PARSE_EQN_FLAG_VAR )
			{
				fprintf( pOutput, "Parse_FormulaParserEqn(): No operation symbol before constant 0.\n" );
				Flag = PARSE_EQN_FLAG_ERROR; 
                break;
			}
            Flag = PARSE_EQN_FLAG_VAR; 
            break;
		case PARSE_EQN_SYM_CONST1:
		    Parse_StackFnPush( pStackFn, Hop_ManConst1(pMan) );  //  Cudd_Ref( b1 );
			if ( Flag == PARSE_EQN_FLAG_VAR )
			{
				fprintf( pOutput, "Parse_FormulaParserEqn(): No operation symbol before constant 1.\n" );
				Flag = PARSE_EQN_FLAG_ERROR; 
                break;
			}
            Flag = PARSE_EQN_FLAG_VAR; 
            break;
		case PARSE_EQN_SYM_NEG:
			if ( Flag == PARSE_EQN_FLAG_VAR )
			{// if NEGBEF follows a variable, AND is assumed
				Parse_StackOpPush( pStackOp, PARSE_EQN_OPER_AND );
				Flag = PARSE_EQN_FLAG_OPER;
			}
    		Parse_StackOpPush( pStackOp, PARSE_EQN_OPER_NEG );
			break;
        case PARSE_EQN_SYM_AND:
        case PARSE_EQN_SYM_OR:
			if ( Flag != PARSE_EQN_FLAG_VAR )
			{
				fprintf( pOutput, "Parse_FormulaParserEqn(): There is no variable before AND, EXOR, or OR.\n" );
				Flag = PARSE_EQN_FLAG_ERROR; 
                break;
			}
			if ( *pTemp == PARSE_EQN_SYM_AND )
				Parse_StackOpPush( pStackOp, PARSE_EQN_OPER_AND );
			else //if ( *pTemp == PARSE_EQN_SYM_OR )
				Parse_StackOpPush( pStackOp, PARSE_EQN_OPER_OR );
			Flag = PARSE_EQN_FLAG_OPER; 
            break;
		case PARSE_EQN_SYM_OPEN:
			if ( Flag == PARSE_EQN_FLAG_VAR )
            {
//				Parse_StackOpPush( pStackOp, PARSE_EQN_OPER_AND );
				fprintf( pOutput, "Parse_FormulaParserEqn(): An opening parenthesis follows a var without operation sign.\n" ); 
				Flag = PARSE_EQN_FLAG_ERROR; 
                break; 
            }
			Parse_StackOpPush( pStackOp, PARSE_EQN_OPER_MARK );
			// after an opening bracket, it feels like starting over again
			Flag = PARSE_EQN_FLAG_START; 
            break;
		case PARSE_EQN_SYM_CLOSE:
			if ( !Parse_StackOpIsEmpty( pStackOp ) )
            {
				while ( 1 )
			    {
				    if ( Parse_StackOpIsEmpty( pStackOp ) )
					{
						fprintf( pOutput, "Parse_FormulaParserEqn(): There is no opening parenthesis\n" );
						Flag = PARSE_EQN_FLAG_ERROR; 
                        break;
					}
					Oper = Parse_StackOpPop( pStackOp );
					if ( Oper == PARSE_EQN_OPER_MARK )
						break;

                    // perform the given operation
                    if ( Parse_ParserPerformTopOp( pMan, pStackFn, Oper ) == NULL )
	                {
                        Parse_StackFnFree( pStackFn );
                        Parse_StackOpFree( pStackOp );
		                fprintf( pOutput, "Parse_FormulaParserEqn(): Unknown operation\n" );
                        ABC_FREE( pFormula );
		                return NULL;
	                }
			    }
            }
		    else
			{
				fprintf( pOutput, "Parse_FormulaParserEqn(): There is no opening parenthesis\n" );
				Flag = PARSE_EQN_FLAG_ERROR; 
                break;
			}
			if ( Flag != PARSE_EQN_FLAG_ERROR )
			    Flag = PARSE_EQN_FLAG_VAR; 
			break;


		default:
            // scan the next name
            for ( i = 0; pTemp[i] && 
                         pTemp[i] != ' ' && pTemp[i] != '\t' && pTemp[i] != '\r' && pTemp[i] != '\n' &&
                         pTemp[i] != PARSE_EQN_SYM_AND && pTemp[i] != PARSE_EQN_SYM_OR && pTemp[i] != PARSE_EQN_SYM_CLOSE; i++ )
              {
				    if ( pTemp[i] == PARSE_EQN_SYM_NEG || pTemp[i] == PARSE_EQN_SYM_OPEN )
				    {
					    fprintf( pOutput, "Parse_FormulaParserEqn(): The negation sign or an opening parenthesis inside the variable name.\n" );
					    Flag = PARSE_EQN_FLAG_ERROR; 
                        break;
				    }
              }
            // variable name is found
            fFound = 0;
            Vec_PtrForEachEntry( char *, vVarNames, pName, v )
                if ( strncmp(pTemp, pName, i) == 0 && strlen(pName) == (unsigned)i )
                {
                    pTemp += i-1;
                    fFound = 1;
                    break;
                }
            if ( !fFound )
			{ 
				fprintf( pOutput, "Parse_FormulaParserEqn(): The parser cannot find var \"%s\" in the input var list.\n", pTemp ); 
				Flag = PARSE_EQN_FLAG_ERROR; 
                break; 
			}
			if ( Flag == PARSE_EQN_FLAG_VAR )
            {
				fprintf( pOutput, "Parse_FormulaParserEqn(): The variable name \"%s\" follows another var without operation sign.\n", pTemp ); 
				Flag = PARSE_EQN_FLAG_ERROR; 
                break; 
            }
			Parse_StackFnPush( pStackFn, Hop_IthVar( pMan, v ) ); // Cudd_Ref( pbVars[v] );
            Flag = PARSE_EQN_FLAG_VAR; 
            break;
	    }

		if ( Flag == PARSE_EQN_FLAG_ERROR )
			break;      // error exit
		else if ( Flag == PARSE_EQN_FLAG_START )
			continue;  //  go on parsing
		else if ( Flag == PARSE_EQN_FLAG_VAR )
			while ( 1 )
			{  // check if there are negations in the OpStack     
				if ( Parse_StackOpIsEmpty(pStackOp) )
					break;
                Oper = Parse_StackOpPop( pStackOp );
				if ( Oper != PARSE_EQN_OPER_NEG )
                {
					Parse_StackOpPush( pStackOp, Oper );
					break;
                }
				else
				{
      				Parse_StackFnPush( pStackFn, Hop_Not((Hop_Obj_t *)Parse_StackFnPop(pStackFn)) );
				}
			}
		else // if ( Flag == PARSE_EQN_FLAG_OPER )
			while ( 1 )
			{  // execute all the operations in the OpStack
			   // with precedence higher or equal than the last one
				Oper1 = Parse_StackOpPop( pStackOp ); // the last operation
				if ( Parse_StackOpIsEmpty(pStackOp) ) 
				{  // if it is the only operation, push it back
					Parse_StackOpPush( pStackOp, Oper1 );
					break;
				}
				Oper2 = Parse_StackOpPop( pStackOp ); // the operation before the last one
				if ( Oper2 >= Oper1 )  
				{  // if Oper2 precedence is higher or equal, execute it
                    if ( Parse_ParserPerformTopOp( pMan, pStackFn, Oper2 ) == NULL )
	                {
		                fprintf( pOutput, "Parse_FormulaParserEqn(): Unknown operation\n" );
                        ABC_FREE( pFormula );
                        Parse_StackFnFree( pStackFn );
                        Parse_StackOpFree( pStackOp );
		                return NULL;
	                }
					Parse_StackOpPush( pStackOp,  Oper1 );     // push the last operation back
				}
				else
				{  // if Oper2 precedence is lower, push them back and done
					Parse_StackOpPush( pStackOp, Oper2 );
					Parse_StackOpPush( pStackOp, Oper1 );
					break;
				}
			}
    }

	if ( Flag != PARSE_EQN_FLAG_ERROR )
    {
		if ( !Parse_StackFnIsEmpty(pStackFn) )
	    {	
			gFunc = (Hop_Obj_t *)Parse_StackFnPop(pStackFn);
			if ( Parse_StackFnIsEmpty(pStackFn) )
				if ( Parse_StackOpIsEmpty(pStackOp) )
                {
                    Parse_StackFnFree(pStackFn);
                    Parse_StackOpFree(pStackOp);
//                    Cudd_Deref( gFunc );
                    ABC_FREE( pFormula );
					return gFunc;
                }
				else
					fprintf( pOutput, "Parse_FormulaParserEqn(): Something is left in the operation stack\n" );
			else
				fprintf( pOutput, "Parse_FormulaParserEqn(): Something is left in the function stack\n" );
	    }
	    else
			fprintf( pOutput, "Parse_FormulaParserEqn(): The input string is empty\n" );
    }
    ABC_FREE( pFormula );
	return NULL;
}